

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe24At7(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)buf[3] >> 1) |
         ((ulong)CONCAT21(CONCAT11(*buf,buf[1]),buf[2]) & 0x1ffff) << 7;
}

Assistant:

std::uint64_t readFlUIntBe24At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 7;
    res |= (buf[3] >> 1);
    res &= UINT64_C(0xffffff);
    return res;
}